

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arg_min_max.cpp
# Opt level: O0

AggregateFunction *
duckdb::
GetVectorArgMinMaxFunctionInternal<duckdb::VectorArgMinMaxBase<duckdb::GreaterThan,false,(duckdb::OrderType)3,duckdb::SpecializedGenericArgMinMaxState>,duckdb::string_t,long>
          (LogicalType *by_type,LogicalType *type)

{
  initializer_list<duckdb::LogicalType> iVar1;
  LogicalType *in_RDX;
  LogicalType *in_RSI;
  AggregateFunction *in_RDI;
  aggregate_destructor_t unaff_retaddr;
  aggregate_statistics_t in_stack_00000008;
  aggregate_window_t in_stack_00000010;
  aggregate_serialize_t in_stack_00000018;
  aggregate_deserialize_t in_stack_00000020;
  allocator_type *in_stack_fffffffffffffec8;
  vector<duckdb::LogicalType,_true> *in_stack_fffffffffffffed0;
  iterator in_stack_fffffffffffffed8;
  size_type in_stack_fffffffffffffee0;
  LogicalType *local_b0;
  aggregate_update_t in_stack_ffffffffffffff78;
  aggregate_initialize_t in_stack_ffffffffffffff80;
  LogicalType *this;
  LogicalType *in_stack_ffffffffffffff90;
  vector<duckdb::LogicalType,_true> *in_stack_ffffffffffffff98;
  AggregateFunction *in_stack_ffffffffffffffa0;
  LogicalType local_58 [24];
  undefined1 *local_40;
  undefined8 local_38;
  aggregate_combine_t in_stack_ffffffffffffffe0;
  AggregateFunction *bind;
  
  bind = in_RDI;
  duckdb::LogicalType::LogicalType((LogicalType *)&stack0xffffffffffffff90,in_RDX);
  this = local_58;
  duckdb::LogicalType::LogicalType(this,in_RSI);
  local_40 = &stack0xffffffffffffff90;
  local_38 = 2;
  std::allocator<duckdb::LogicalType>::allocator((allocator<duckdb::LogicalType> *)0x967741);
  iVar1._M_len = in_stack_fffffffffffffee0;
  iVar1._M_array = in_stack_fffffffffffffed8;
  vector<duckdb::LogicalType,_true>::vector
            (in_stack_fffffffffffffed0,iVar1,in_stack_fffffffffffffec8);
  AggregateFunction::AggregateFunction
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffff90,
             (aggregate_size_t)this,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
             in_stack_ffffffffffffffe0,(aggregate_finalize_t)in_RDX,
             (aggregate_simple_update_t)in_RSI,(bind_aggregate_function_t)bind,unaff_retaddr,
             in_stack_00000008,in_stack_00000010,in_stack_00000018,in_stack_00000020);
  vector<duckdb::LogicalType,_true>::~vector((vector<duckdb::LogicalType,_true> *)0x967807);
  std::allocator<duckdb::LogicalType>::~allocator((allocator<duckdb::LogicalType> *)0x967814);
  local_b0 = (LogicalType *)&local_40;
  do {
    local_b0 = local_b0 + -0x18;
    duckdb::LogicalType::~LogicalType(local_b0);
  } while (local_b0 != (LogicalType *)&stack0xffffffffffffff90);
  return in_RDI;
}

Assistant:

AggregateFunction GetVectorArgMinMaxFunctionInternal(const LogicalType &by_type, const LogicalType &type) {
#ifndef DUCKDB_SMALLER_BINARY
	using STATE = ArgMinMaxState<ARG_TYPE, BY_TYPE>;
	return AggregateFunction({type, by_type}, type, AggregateFunction::StateSize<STATE>,
	                         AggregateFunction::StateInitialize<STATE, OP, AggregateDestructorType::LEGACY>,
	                         OP::template Update<STATE>, AggregateFunction::StateCombine<STATE, OP>,
	                         AggregateFunction::StateVoidFinalize<STATE, OP>, nullptr, OP::Bind,
	                         AggregateFunction::StateDestroy<STATE, OP>);
#else
	auto function = GetGenericArgMinMaxFunction<OP>();
	function.arguments = {type, by_type};
	function.return_type = type;
	return function;
#endif
}